

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_true>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  size_t sVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  float fVar3;
  float fVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  bool bVar7;
  _func_int **pp_Var8;
  undefined4 uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  size_t sVar13;
  size_t sVar14;
  int iVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  NodeRef *pNVar19;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar23;
  undefined1 auVar24 [64];
  vfloat_impl<4> __tmp;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar31;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  undefined1 in_ZMM2 [64];
  vint4 ai_2;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 ai_1;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai_3;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 bi_3;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 ai;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi_2;
  undefined1 auVar51 [16];
  float fVar52;
  float fVar54;
  float fVar55;
  undefined1 auVar53 [16];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  vint<4> octant;
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  RayQueryContext *local_17c0;
  long local_17b8;
  RTCIntersectFunctionNArguments local_17b0;
  Geometry *local_1780;
  undefined8 local_1778;
  RTCIntersectArguments *local_1770;
  undefined1 local_1768 [16];
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1708;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar22 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar28 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar22);
    iVar15 = vmovmskps_avx(auVar28);
    uVar16 = CONCAT44((int)((ulong)This >> 0x20),iVar15);
    if (iVar15 != 0) {
      auVar26 = *(undefined1 (*) [16])(ray + 0x40);
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar53 = vandps_avx(auVar26,auVar25);
      auVar37._8_4_ = 0x219392ef;
      auVar37._0_8_ = 0x219392ef219392ef;
      auVar37._12_4_ = 0x219392ef;
      auVar53 = vcmpps_avx(auVar53,auVar37,1);
      auVar57 = vblendvps_avx(auVar26,auVar37,auVar53);
      auVar53 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar25);
      auVar53 = vcmpps_avx(auVar53,auVar37,1);
      auVar33 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar37,auVar53);
      auVar53 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar25);
      auVar53 = vcmpps_avx(auVar53,auVar37,1);
      auVar53 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar37,auVar53);
      auVar25 = vrcpps_avx(auVar57);
      fVar52 = auVar25._0_4_;
      auVar32._0_4_ = auVar57._0_4_ * fVar52;
      fVar54 = auVar25._4_4_;
      auVar32._4_4_ = auVar57._4_4_ * fVar54;
      fVar55 = auVar25._8_4_;
      auVar32._8_4_ = auVar57._8_4_ * fVar55;
      fVar56 = auVar25._12_4_;
      auVar32._12_4_ = auVar57._12_4_ * fVar56;
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = &DAT_3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      auVar25 = vsubps_avx(auVar51,auVar32);
      auVar57 = vrcpps_avx(auVar33);
      fVar62 = auVar57._0_4_;
      auVar38._0_4_ = auVar33._0_4_ * fVar62;
      fVar63 = auVar57._4_4_;
      auVar38._4_4_ = auVar33._4_4_ * fVar63;
      fVar64 = auVar57._8_4_;
      auVar38._8_4_ = auVar33._8_4_ * fVar64;
      fVar65 = auVar57._12_4_;
      auVar38._12_4_ = auVar33._12_4_ * fVar65;
      auVar33 = vsubps_avx(auVar51,auVar38);
      auVar57 = vrcpps_avx(auVar53);
      fVar3 = auVar57._0_4_;
      auVar49._0_4_ = auVar53._0_4_ * fVar3;
      fVar4 = auVar57._4_4_;
      auVar49._4_4_ = auVar53._4_4_ * fVar4;
      fVar27 = auVar57._8_4_;
      auVar49._8_4_ = auVar53._8_4_ * fVar27;
      fVar29 = auVar57._12_4_;
      auVar49._12_4_ = auVar53._12_4_ * fVar29;
      auVar32 = vsubps_avx(auVar51,auVar49);
      auVar37 = ZEXT416(0) << 0x20;
      auVar26 = vcmpps_avx(auVar26,auVar37,1);
      auVar53._8_4_ = 1;
      auVar53._0_8_ = 0x100000001;
      auVar53._12_4_ = 1;
      auVar26 = vandps_avx(auVar53,auVar26);
      auVar53 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar37,1);
      auVar57._8_4_ = 2;
      auVar57._0_8_ = 0x200000002;
      auVar57._12_4_ = 2;
      auVar53 = vandps_avx(auVar57,auVar53);
      auVar57 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar37);
      auVar53 = vorps_avx(auVar53,auVar26);
      auVar26 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar37,1);
      auVar58._8_4_ = 4;
      auVar58._0_8_ = 0x400000004;
      auVar58._12_4_ = 4;
      auVar26 = vandps_avx(auVar26,auVar58);
      auVar59 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar60 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar22 = vpor_avx(auVar26,auVar28 ^ auVar22);
      auVar61 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      local_17d8 = vpor_avx(auVar53,auVar22);
      do {
        lVar11 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
          }
        }
        uVar9 = *(undefined4 *)(local_17d8 + lVar11 * 4);
        auVar22._4_4_ = uVar9;
        auVar22._0_4_ = uVar9;
        auVar22._8_4_ = uVar9;
        auVar22._12_4_ = uVar9;
        auVar22 = vpcmpeqd_avx(auVar22,local_17d8);
        uVar9 = vmovmskps_avx(auVar22);
        uVar16 = uVar16 & ~CONCAT44((int)((ulong)lVar11 >> 0x20),uVar9);
      } while (uVar16 != 0);
      auVar22 = vpcmpeqd_avx(local_17d8,local_17d8);
      auVar28 = vpcmpeqd_avx(auVar22,(undefined1  [16])valid_i->field_0);
      fVar52 = fVar52 + fVar52 * auVar25._0_4_;
      fVar54 = fVar54 + fVar54 * auVar25._4_4_;
      fVar55 = fVar55 + fVar55 * auVar25._8_4_;
      fVar56 = fVar56 + fVar56 * auVar25._12_4_;
      fVar62 = fVar62 + auVar33._0_4_ * fVar62;
      fVar63 = fVar63 + auVar33._4_4_ * fVar63;
      fVar64 = fVar64 + auVar33._8_4_ * fVar64;
      fVar65 = fVar65 + auVar33._12_4_ * fVar65;
      local_16f8 = auVar32._0_4_ * fVar3 + fVar3;
      fStack_16f4 = auVar32._4_4_ * fVar4 + fVar4;
      fStack_16f0 = auVar32._8_4_ * fVar27 + fVar27;
      fStack_16ec = auVar32._12_4_ * fVar29 + fVar29;
      auVar22 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT416(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_1708.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar22,auVar28);
      auVar26._8_4_ = 0xff800000;
      auVar26._0_8_ = 0xff800000ff800000;
      auVar26._12_4_ = 0xff800000;
      local_17e8 = vblendvps_avx(auVar26,auVar57,auVar28);
      pNVar19 = stack_node + 2;
      paVar20 = &stack_near[2].field_0;
      local_17d8 = vorps_avx(auVar28,local_17d8);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      stack_near[1].field_0 = local_1708;
      do {
        paVar20 = paVar20 + -1;
        sVar14 = pNVar19[-1].ptr;
        pNVar19 = pNVar19 + -1;
        bVar7 = true;
        if (sVar14 != 0xfffffffffffffff8) {
          auVar24 = ZEXT1664((undefined1  [16])*paVar20);
          auVar22 = vcmpps_avx((undefined1  [16])*paVar20,local_17e8,1);
          if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar22[0xf] < '\0') {
            do {
              auVar22 = auVar24._0_16_;
              uVar12 = (uint)sVar14;
              local_1718 = auVar59._0_16_;
              local_1728 = auVar60._0_16_;
              local_1738 = auVar61._0_16_;
              if ((sVar14 & 8) != 0) {
                if (sVar14 == 0xfffffffffffffff8) goto LAB_00333a55;
                auVar22 = vcmpps_avx(local_17e8,auVar22,6);
                auVar24 = ZEXT1664(auVar22);
                if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar22[0xf] < '\0') {
                  local_17b8 = (ulong)(uVar12 & 0xf) - 8;
                  if (local_17b8 != 0) {
                    lVar11 = 0;
                    local_17c0 = context;
                    local_1748 = fVar52;
                    fStack_1744 = fVar54;
                    fStack_1740 = fVar55;
                    fStack_173c = fVar56;
                    local_1758 = fVar62;
                    fStack_1754 = fVar63;
                    fStack_1750 = fVar64;
                    fStack_174c = fVar65;
                    local_1768 = auVar22;
                    do {
                      local_17b0.geomID = *(uint *)((sVar14 & 0xfffffffffffffff0) + lVar11 * 8);
                      local_1780 = (context->scene->geometries).items[local_17b0.geomID].ptr;
                      uVar12 = local_1780->mask;
                      auVar28._4_4_ = uVar12;
                      auVar28._0_4_ = uVar12;
                      auVar28._8_4_ = uVar12;
                      auVar28._12_4_ = uVar12;
                      auVar22 = vandps_avx(auVar28,*(undefined1 (*) [16])(ray + 0x90));
                      auVar22 = vpcmpeqd_avx(auVar22,_DAT_01feba10);
                      auVar28 = auVar24._0_16_ & ~auVar22;
                      if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar28[0xf] < '\0') {
                        mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vandnps_avx(auVar22,auVar24._0_16_);
                        local_17b0.primID =
                             *(uint *)((sVar14 & 0xfffffffffffffff0) + 4 + lVar11 * 8);
                        local_17b0.valid = (int *)&mask;
                        local_17b0.geometryUserPtr = local_1780->userPtr;
                        local_17b0.context = context->user;
                        local_17b0.N = 4;
                        local_1778 = 0;
                        local_1770 = context->args;
                        pp_Var8 = (_func_int **)local_1770->intersect;
                        if (pp_Var8 == (_func_int **)0x0) {
                          pp_Var8 = local_1780[1].super_RefCount._vptr_RefCount;
                        }
                        local_17b0.rayhit = (RTCRayHitN *)ray;
                        (*(code *)pp_Var8)(&local_17b0);
                        auVar59 = ZEXT1664(local_1718);
                        auVar60 = ZEXT1664(local_1728);
                        auVar61 = ZEXT1664(local_1738);
                        auVar24 = ZEXT1664(local_1768);
                        context = local_17c0;
                        fVar52 = local_1748;
                        fVar54 = fStack_1744;
                        fVar55 = fStack_1740;
                        fVar56 = fStack_173c;
                        fVar62 = local_1758;
                        fVar63 = fStack_1754;
                        fVar64 = fStack_1750;
                        fVar65 = fStack_174c;
                      }
                      auVar22 = auVar24._0_16_;
                      lVar11 = lVar11 + 1;
                    } while (local_17b8 != lVar11);
                  }
                  local_17e8 = vblendvps_avx(local_17e8,*(undefined1 (*) [16])(ray + 0x80),auVar22);
                }
                break;
              }
              uVar10 = sVar14 & 0xfffffffffffffff0;
              uVar18 = 0;
              auVar24 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              sVar13 = 8;
              uVar16 = 0;
              do {
                sVar1 = *(size_t *)(uVar10 + uVar16 * 8);
                sVar14 = sVar13;
                if (sVar1 != 8) {
                  fVar3 = *(float *)(uVar10 + 0x80 + uVar16 * 4);
                  fVar4 = *(float *)(uVar10 + 0x20 + uVar16 * 4);
                  auVar28 = *(undefined1 (*) [16])(ray + 0x70);
                  fVar27 = auVar28._0_4_;
                  fVar29 = auVar28._4_4_;
                  fVar30 = auVar28._8_4_;
                  fVar31 = auVar28._12_4_;
                  auVar33._0_4_ = fVar27 * fVar3 + fVar4;
                  auVar33._4_4_ = fVar29 * fVar3 + fVar4;
                  auVar33._8_4_ = fVar30 * fVar3 + fVar4;
                  auVar33._12_4_ = fVar31 * fVar3 + fVar4;
                  fVar3 = *(float *)(uVar10 + 0xa0 + uVar16 * 4);
                  fVar4 = *(float *)(uVar10 + 0x40 + uVar16 * 4);
                  auVar34._0_4_ = fVar27 * fVar3 + fVar4;
                  auVar34._4_4_ = fVar29 * fVar3 + fVar4;
                  auVar34._8_4_ = fVar30 * fVar3 + fVar4;
                  auVar34._12_4_ = fVar31 * fVar3 + fVar4;
                  fVar3 = *(float *)(uVar10 + 0xc0 + uVar16 * 4);
                  fVar4 = *(float *)(uVar10 + 0x60 + uVar16 * 4);
                  auVar39._0_4_ = fVar27 * fVar3 + fVar4;
                  auVar39._4_4_ = fVar29 * fVar3 + fVar4;
                  auVar39._8_4_ = fVar30 * fVar3 + fVar4;
                  auVar39._12_4_ = fVar31 * fVar3 + fVar4;
                  fVar3 = *(float *)(uVar10 + 0x90 + uVar16 * 4);
                  fVar4 = *(float *)(uVar10 + 0x30 + uVar16 * 4);
                  auVar42._0_4_ = fVar27 * fVar3 + fVar4;
                  auVar42._4_4_ = fVar29 * fVar3 + fVar4;
                  auVar42._8_4_ = fVar30 * fVar3 + fVar4;
                  auVar42._12_4_ = fVar31 * fVar3 + fVar4;
                  fVar3 = *(float *)(uVar10 + 0xb0 + uVar16 * 4);
                  fVar4 = *(float *)(uVar10 + 0x50 + uVar16 * 4);
                  auVar45._0_4_ = fVar4 + fVar27 * fVar3;
                  auVar45._4_4_ = fVar4 + fVar29 * fVar3;
                  auVar45._8_4_ = fVar4 + fVar30 * fVar3;
                  auVar45._12_4_ = fVar4 + fVar31 * fVar3;
                  fVar3 = *(float *)(uVar10 + 0xd0 + uVar16 * 4);
                  fVar4 = *(float *)(uVar10 + 0x70 + uVar16 * 4);
                  auVar47._0_4_ = fVar3 * fVar27 + fVar4;
                  auVar47._4_4_ = fVar3 * fVar29 + fVar4;
                  auVar47._8_4_ = fVar3 * fVar30 + fVar4;
                  auVar47._12_4_ = fVar3 * fVar31 + fVar4;
                  auVar26 = vsubps_avx(auVar33,local_1718);
                  auVar50._0_4_ = fVar52 * auVar26._0_4_;
                  auVar50._4_4_ = fVar54 * auVar26._4_4_;
                  auVar50._8_4_ = fVar55 * auVar26._8_4_;
                  auVar50._12_4_ = fVar56 * auVar26._12_4_;
                  auVar26 = vsubps_avx(auVar34,local_1728);
                  auVar35._0_4_ = fVar62 * auVar26._0_4_;
                  auVar35._4_4_ = fVar63 * auVar26._4_4_;
                  auVar35._8_4_ = fVar64 * auVar26._8_4_;
                  auVar35._12_4_ = fVar65 * auVar26._12_4_;
                  auVar26 = vsubps_avx(auVar39,local_1738);
                  auVar40._0_4_ = local_16f8 * auVar26._0_4_;
                  auVar40._4_4_ = fStack_16f4 * auVar26._4_4_;
                  auVar40._8_4_ = fStack_16f0 * auVar26._8_4_;
                  auVar40._12_4_ = fStack_16ec * auVar26._12_4_;
                  auVar26 = vsubps_avx(auVar42,local_1718);
                  auVar43._0_4_ = fVar52 * auVar26._0_4_;
                  auVar43._4_4_ = fVar54 * auVar26._4_4_;
                  auVar43._8_4_ = fVar55 * auVar26._8_4_;
                  auVar43._12_4_ = fVar56 * auVar26._12_4_;
                  auVar26 = vsubps_avx(auVar45,local_1728);
                  auVar46._0_4_ = fVar62 * auVar26._0_4_;
                  auVar46._4_4_ = fVar63 * auVar26._4_4_;
                  auVar46._8_4_ = fVar64 * auVar26._8_4_;
                  auVar46._12_4_ = fVar65 * auVar26._12_4_;
                  auVar26 = vsubps_avx(auVar47,local_1738);
                  auVar48._0_4_ = local_16f8 * auVar26._0_4_;
                  auVar48._4_4_ = fStack_16f4 * auVar26._4_4_;
                  auVar48._8_4_ = fStack_16f0 * auVar26._8_4_;
                  auVar48._12_4_ = fStack_16ec * auVar26._12_4_;
                  auVar26 = vpminsd_avx(auVar50,auVar43);
                  auVar53 = vpminsd_avx(auVar35,auVar46);
                  auVar26 = vpmaxsd_avx(auVar26,auVar53);
                  auVar53 = vpminsd_avx(auVar40,auVar48);
                  auVar26 = vpmaxsd_avx(auVar26,auVar53);
                  auVar53 = vpmaxsd_avx(auVar50,auVar43);
                  auVar57 = vpmaxsd_avx(auVar35,auVar46);
                  auVar57 = vpminsd_avx(auVar53,auVar57);
                  auVar53 = vpmaxsd_avx(auVar40,auVar48);
                  auVar53 = vpminsd_avx(auVar53,local_17e8);
                  auVar57 = vpminsd_avx(auVar57,auVar53);
                  auVar53 = vpmaxsd_avx(auVar26,(undefined1  [16])local_1708);
                  if ((uVar12 & 7) == 6) {
                    auVar53 = vcmpps_avx(auVar53,auVar57,2);
                    uVar9 = *(undefined4 *)(uVar10 + 0xe0 + uVar16 * 4);
                    auVar41._4_4_ = uVar9;
                    auVar41._0_4_ = uVar9;
                    auVar41._8_4_ = uVar9;
                    auVar41._12_4_ = uVar9;
                    auVar57 = vcmpps_avx(auVar41,auVar28,2);
                    uVar9 = *(undefined4 *)(uVar10 + 0xf0 + uVar16 * 4);
                    auVar44._4_4_ = uVar9;
                    auVar44._0_4_ = uVar9;
                    auVar44._8_4_ = uVar9;
                    auVar44._12_4_ = uVar9;
                    auVar28 = vcmpps_avx(auVar28,auVar44,1);
                    auVar28 = vandps_avx(auVar57,auVar28);
                    auVar28 = vandps_avx(auVar28,auVar53);
                  }
                  else {
                    auVar28 = vcmpps_avx(auVar53,auVar57,2);
                  }
                  auVar53 = vcmpps_avx(local_17e8,auVar22,6);
                  auVar28 = vandps_avx(auVar28,auVar53);
                  auVar28 = vpslld_avx(auVar28,0x1f);
                  if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar28[0xf] < '\0') {
                    auVar36._8_4_ = 0x7f800000;
                    auVar36._0_8_ = 0x7f8000007f800000;
                    auVar36._12_4_ = 0x7f800000;
                    aVar2 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                            vblendvps_avx(auVar36,auVar26,auVar28);
                    aVar23 = auVar24._0_16_;
                    auVar28 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar23,1);
                    sVar17 = sVar1;
                    aVar5 = aVar23;
                    aVar6 = aVar2;
                    if (((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                          (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         -1 < auVar28[0xf]) ||
                       (sVar14 = sVar1, sVar17 = sVar13, aVar5 = aVar2, aVar6 = aVar23, sVar13 != 8)
                       ) {
                      uVar18 = uVar18 + 1;
                      pNVar19->ptr = sVar17;
                      pNVar19 = pNVar19 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar20->v = aVar6;
                      paVar20 = paVar20 + 1;
                      auVar24 = ZEXT1664((undefined1  [16])aVar5);
                    }
                    else {
                      auVar24 = ZEXT1664((undefined1  [16])aVar2);
                    }
                  }
                }
              } while ((sVar1 != 8) &&
                      (bVar21 = uVar16 < 3, sVar13 = sVar14, uVar16 = uVar16 + 1, bVar21));
              if (1 < uVar18 && sVar14 != 8) {
                aVar2 = paVar20[-2];
                auVar22 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])paVar20[-1],1);
                if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar22[0xf] < '\0') {
                  paVar20[-2] = paVar20[-1];
                  paVar20[-1] = aVar2;
                  auVar22 = vpermilps_avx(*(undefined1 (*) [16])(pNVar19 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar19 + -2) = auVar22;
                }
                if (uVar18 != 2) {
                  aVar2 = paVar20[-3];
                  auVar22 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])paVar20[-1],1);
                  if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar22[0xf] < '\0') {
                    paVar20[-3] = paVar20[-1];
                    paVar20[-1] = aVar2;
                    sVar13 = pNVar19[-3].ptr;
                    pNVar19[-3].ptr = pNVar19[-1].ptr;
                    pNVar19[-1].ptr = sVar13;
                  }
                  aVar2 = paVar20[-3];
                  auVar22 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])paVar20[-2],1);
                  if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar22[0xf] < '\0') {
                    paVar20[-3] = paVar20[-2];
                    paVar20[-2] = aVar2;
                    auVar22 = vpermilps_avx(*(undefined1 (*) [16])(pNVar19 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar19 + -3) = auVar22;
                  }
                }
              }
            } while (sVar14 != 8);
          }
          bVar7 = false;
        }
LAB_00333a55:
      } while (!bVar7);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }